

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void Eigen::internal::general_matrix_matrix_product<long,_double,_1,_false,_double,_1,_false,_0>::
     run(long rows,long cols,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,
        ResScalar *_res,long resStride,ResScalar alpha,level3_blocking<double,_double> *blocking,
        GemmParallelInfo<long> *info)

{
  long lVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  LhsScalar *pLVar5;
  RhsScalar *pRVar6;
  undefined1 *puVar7;
  undefined1 auStackY_3c8 [8];
  size_t in_stack_fffffffffffffc40;
  bool local_379;
  RhsScalar *local_368;
  RhsScalar *local_360;
  long local_320;
  long local_318;
  long actual_nc;
  long j2;
  long local_300;
  long local_2f8;
  long local_2f0;
  long actual_kc;
  long k2;
  long local_2d8;
  long actual_mc;
  long i2;
  bool pack_rhs_once;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *blockB;
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeB;
  size_t sizeA;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  gebp;
  gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
  pack_rhs;
  Index IStack_258;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
  pack_lhs;
  long nc;
  long local_240;
  long mc;
  long kc;
  ResMapper res;
  RhsMapper rhs;
  LhsMapper lhs;
  ResScalar alpha_local;
  double *_rhs_local;
  long lhsStride_local;
  double *_lhs_local;
  long depth_local;
  long cols_local;
  long rows_local;
  ulong local_1c0;
  long local_1b8;
  ResScalar *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long *local_190;
  undefined1 local_188 [16];
  double *local_178;
  long local_170;
  undefined1 *local_168;
  long local_160;
  long local_158;
  long *local_150;
  long local_148;
  double *local_140;
  long *local_138;
  long local_130;
  double *local_128;
  long *local_120;
  long local_118;
  long local_110;
  long *local_108;
  undefined1 local_100 [16];
  double *local_f0;
  long local_e8;
  undefined1 *local_e0;
  long local_d8;
  long local_d0;
  long *local_c8;
  undefined1 local_c0 [16];
  long local_b0;
  long local_a8;
  undefined1 *local_a0;
  long local_98;
  long local_90;
  undefined1 *local_88;
  double *local_80;
  long local_78;
  undefined1 *local_70;
  long local_68;
  double *local_60;
  long *local_58;
  long local_50;
  double *local_48;
  long *local_40;
  long local_38;
  long local_30;
  long *local_28;
  long local_20;
  long local_18;
  long *local_10;
  
  puVar7 = auStackY_3c8;
  local_138 = &rhs.super_blas_data_mapper<const_double,_long,_1,_0>.m_stride;
  local_120 = &res.m_stride;
  local_130 = rhsStride;
  local_68 = rhsStride;
  rhs.super_blas_data_mapper<const_double,_long,_1,_0>.m_data = (double *)rhsStride;
  local_1a8 = &kc;
  local_1b0 = _res;
  local_1b8 = resStride;
  kc = (long)_res;
  res.m_data = (double *)resStride;
  _lhs_local = (double *)depth;
  depth_local = cols;
  cols_local = rows;
  local_148 = lhsStride;
  local_140 = _lhs;
  local_128 = _rhs;
  local_60 = _rhs;
  local_58 = local_120;
  local_50 = lhsStride;
  local_48 = _lhs;
  local_40 = local_138;
  res.m_stride = (long)_rhs;
  rhs.super_blas_data_mapper<const_double,_long,_1,_0>.m_stride = (long)_lhs;
  mc = level3_blocking<double,_double>::kc(blocking);
  nc = level3_blocking<double,_double>::mc(blocking);
  plVar2 = std::min<long>(&cols_local,&nc);
  local_240 = *plVar2;
  IStack_258 = level3_blocking<double,_double>::nc(blocking);
  plVar2 = std::min<long>(&depth_local,&stack0xfffffffffffffda8);
  lVar1 = *plVar2;
  ignore_unused_variable<Eigen::internal::GemmParallelInfo<long>*>(&info);
  uVar3 = mc * local_240;
  uVar4 = mc * lVar1;
  local_1c0 = uVar3;
  if (0x1fffffffffffffff < uVar3) {
    throw_std_bad_alloc();
  }
  pLVar5 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar5 == (LhsScalar *)0x0) {
    if (uVar3 * 8 < 0x20001) {
      puVar7 = auStackY_3c8 + -(uVar3 * 8 + 0x1e & 0xfffffffffffffff0);
    }
    else {
      aligned_malloc(in_stack_fffffffffffffc40);
    }
  }
  else {
    level3_blocking<double,_double>::blockA(blocking);
    puVar7 = auStackY_3c8;
  }
  *(undefined8 *)(puVar7 + -8) = 0x15bc70;
  level3_blocking<double,_double>::blockA(blocking);
  *(undefined8 *)(puVar7 + -8) = 0x15bcc5;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            (*(aligned_stack_memory_handler<double> **)(puVar7 + 0x18),*(double **)(puVar7 + 0x10),
             *(size_t *)(puVar7 + 8),(bool)puVar7[7]);
  rows_local = uVar4;
  if (0x1fffffffffffffff < uVar4) {
    *(undefined8 *)(puVar7 + -8) = 0x15bceb;
    throw_std_bad_alloc();
  }
  *(undefined8 *)(puVar7 + -8) = 0x15bcfa;
  pRVar6 = level3_blocking<double,_double>::blockB(blocking);
  if (pRVar6 == (RhsScalar *)0x0) {
    if (uVar4 * 8 < 0x20001) {
      puVar7 = puVar7 + -(uVar4 * 8 + 0x1e & 0xfffffffffffffff0);
      local_368 = (RhsScalar *)((ulong)(puVar7 + 0xf) & 0xfffffffffffffff0);
    }
    else {
      *(undefined8 *)(puVar7 + -8) = 0x15bd66;
      local_368 = (RhsScalar *)aligned_malloc(*(size_t *)(puVar7 + 8));
    }
    local_360 = local_368;
  }
  else {
    *(undefined8 *)(puVar7 + -8) = 0x15bd09;
    local_360 = level3_blocking<double,_double>::blockB(blocking);
  }
  blockB_stack_memory_destructor._16_8_ = local_360;
  *(undefined8 *)(puVar7 + -8) = 0x15bda4;
  level3_blocking<double,_double>::blockB(blocking);
  *(undefined8 *)(puVar7 + -8) = 0x15bdf2;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            (*(aligned_stack_memory_handler<double> **)(puVar7 + 0x18),*(double **)(puVar7 + 0x10),
             *(size_t *)(puVar7 + 8),(bool)puVar7[7]);
  local_379 = false;
  if ((local_240 != cols_local) && (local_379 = false, (double *)mc == _lhs_local)) {
    local_379 = lVar1 == depth_local;
  }
  i2._7_1_ = local_379;
  for (actual_mc = 0; actual_mc < cols_local; actual_mc = local_240 + actual_mc) {
    k2 = actual_mc + local_240;
    *(undefined8 *)(puVar7 + -8) = 0x15be90;
    plVar2 = std::min<long>(&k2,&cols_local);
    local_2d8 = *plVar2 - actual_mc;
    for (actual_kc = 0; actual_kc < (long)_lhs_local; actual_kc = mc + actual_kc) {
      local_2f8 = actual_kc + mc;
      *(undefined8 *)(puVar7 + -8) = 0x15beeb;
      plVar2 = std::min<long>(&local_2f8,(long *)&_lhs_local);
      local_2f0 = *plVar2 - actual_kc;
      local_c8 = &rhs.super_blas_data_mapper<const_double,_long,_1,_0>.m_stride;
      local_d0 = actual_mc;
      local_d8 = actual_kc;
      local_28 = local_c8;
      local_30 = actual_mc;
      local_38 = actual_kc;
      local_a8 = rhs.super_blas_data_mapper<const_double,_long,_1,_0>.m_stride +
                 (actual_kc + actual_mc * lhsStride) * 8;
      local_a0 = local_c0;
      local_b0 = lhsStride;
      local_88 = local_c0;
      local_90 = local_a8;
      local_98 = lhsStride;
      j2 = local_a8;
      local_300 = lhsStride;
      *(undefined8 *)(puVar7 + -0x10) = 0;
      *(undefined8 *)(puVar7 + -0x18) = 0x15c049;
      gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
      ::operator()(*(gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
                     **)(puVar7 + 0xd0),*(double **)(puVar7 + 200),
                   *(const_blas_data_mapper<double,_long,_1> **)(puVar7 + 0xc0),
                   *(long *)(puVar7 + 0xb8),*(long *)(puVar7 + 0xb0),*(long *)(puVar7 + 0xa8),
                   *(long *)(puVar7 + 0x1a8));
      for (actual_nc = 0; actual_nc < depth_local; actual_nc = lVar1 + actual_nc) {
        local_320 = actual_nc + lVar1;
        *(undefined8 *)(puVar7 + -8) = 0x15c096;
        plVar2 = std::min<long>(&local_320,&depth_local);
        local_318 = *plVar2 - actual_nc;
        if (((i2._7_1_ & 1) == 0) || (actual_mc == 0)) {
          local_108 = &res.m_stride;
          local_110 = actual_kc;
          local_118 = actual_nc;
          local_10 = &res.m_stride;
          local_18 = actual_kc;
          local_20 = actual_nc;
          local_e8 = res.m_stride +
                     (actual_nc +
                     actual_kc * (long)rhs.super_blas_data_mapper<const_double,_long,_1,_0>.m_data)
                     * 8;
          local_e0 = local_100;
          local_f0 = rhs.super_blas_data_mapper<const_double,_long,_1,_0>.m_data;
          local_70 = local_100;
          local_78 = local_e8;
          local_80 = rhs.super_blas_data_mapper<const_double,_long,_1,_0>.m_data;
          *(undefined8 *)(puVar7 + -0x10) = 0;
          *(undefined8 *)(puVar7 + -0x18) = 0x15c1fc;
          gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
          ::operator()(*(gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
                         **)(puVar7 + 0x68),*(double **)(puVar7 + 0x60),
                       *(const_blas_data_mapper<double,_long,_1> **)(puVar7 + 0x58),
                       *(long *)(puVar7 + 0x50),*(long *)(puVar7 + 0x48),*(long *)(puVar7 + 0x40),
                       *(long *)(puVar7 + 0x118));
        }
        local_190 = &kc;
        local_198 = actual_mc;
        local_1a0 = actual_nc;
        local_150 = &kc;
        local_158 = actual_mc;
        local_160 = actual_nc;
        local_168 = local_188;
        local_170 = kc + (actual_mc + actual_nc * (long)res.m_data) * 8;
        local_178 = res.m_data;
        *(long *)(puVar7 + -0x30) = local_318;
        *(undefined8 *)(puVar7 + -0x10) = 0;
        *(undefined8 *)(puVar7 + -0x18) = 0;
        *(undefined8 *)(puVar7 + -0x20) = 0xffffffffffffffff;
        *(undefined8 *)(puVar7 + -0x28) = 0xffffffffffffffff;
        *(undefined8 *)(puVar7 + -0x38) = 0x15c395;
        gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
        ::operator()(*(gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
                       **)(puVar7 + 0x620),
                     *(blas_data_mapper<double,_long,_0,_0> **)(puVar7 + 0x618),
                     *(double **)(puVar7 + 0x610),*(double **)(puVar7 + 0x608),
                     *(long *)(puVar7 + 0x600),*(long *)(puVar7 + 0x5f8),*(long *)(puVar7 + 0xe58),
                     *(ResScalar *)(puVar7 + 0x5f0),*(long *)(puVar7 + 0xe60),
                     *(long *)(puVar7 + 0xe68),*(long *)(puVar7 + 0xe70),*(long *)(puVar7 + 0xe78));
      }
    }
  }
  *(undefined8 *)(puVar7 + -8) = 0x15c3fb;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            (*(aligned_stack_memory_handler<double> **)(puVar7 + 8));
  *(undefined8 *)(puVar7 + -8) = 0x15c407;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            (*(aligned_stack_memory_handler<double> **)(puVar7 + 8));
  return;
}

Assistant:

static void run(Index rows, Index cols, Index depth,
  const LhsScalar* _lhs, Index lhsStride,
  const RhsScalar* _rhs, Index rhsStride,
  ResScalar* _res, Index resStride,
  ResScalar alpha,
  level3_blocking<LhsScalar,RhsScalar>& blocking,
  GemmParallelInfo<Index>* info = 0)
{
  typedef const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> LhsMapper;
  typedef const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> RhsMapper;
  typedef blas_data_mapper<typename Traits::ResScalar, Index, ColMajor> ResMapper;
  LhsMapper lhs(_lhs,lhsStride);
  RhsMapper rhs(_rhs,rhsStride);
  ResMapper res(_res, resStride);

  Index kc = blocking.kc();                   // cache block size along the K direction
  Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction
  Index nc = (std::min)(cols,blocking.nc());  // cache block size along the N direction

  gemm_pack_lhs<LhsScalar, Index, LhsMapper, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
  gemm_pack_rhs<RhsScalar, Index, RhsMapper, Traits::nr, RhsStorageOrder> pack_rhs;
  gebp_kernel<LhsScalar, RhsScalar, Index, ResMapper, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;

#ifdef EIGEN_HAS_OPENMP
  if(info)
  {
    // this is the parallel version!
    int tid = omp_get_thread_num();
    int threads = omp_get_num_threads();

    LhsScalar* blockA = blocking.blockA();
    eigen_internal_assert(blockA!=0);

    std::size_t sizeB = kc*nc;
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, 0);

    // For each horizontal panel of the rhs, and corresponding vertical panel of the lhs...
    for(Index k=0; k<depth; k+=kc)
    {
      const Index actual_kc = (std::min)(k+kc,depth)-k; // => rows of B', and cols of the A'

      // In order to reduce the chance that a thread has to wait for the other,
      // let's start by packing B'.
      pack_rhs(blockB, rhs.getSubMapper(k,0), actual_kc, nc);

      // Pack A_k to A' in a parallel fashion:
      // each thread packs the sub block A_k,i to A'_i where i is the thread id.

      // However, before copying to A'_i, we have to make sure that no other thread is still using it,
      // i.e., we test that info[tid].users equals 0.
      // Then, we set info[tid].users to the number of threads to mark that all other threads are going to use it.
      while(info[tid].users!=0) {}
      info[tid].users += threads;

      pack_lhs(blockA+info[tid].lhs_start*actual_kc, lhs.getSubMapper(info[tid].lhs_start,k), actual_kc, info[tid].lhs_length);

      // Notify the other threads that the part A'_i is ready to go.
      info[tid].sync = k;

      // Computes C_i += A' * B' per A'_i
      for(int shift=0; shift<threads; ++shift)
      {
        int i = (tid+shift)%threads;

        // At this point we have to make sure that A'_i has been updated by the thread i,
        // we use testAndSetOrdered to mimic a volatile access.
        // However, no need to wait for the B' part which has been updated by the current thread!
        if (shift>0) {
          while(info[i].sync!=k) {
          }
        }

        gebp(res.getSubMapper(info[i].lhs_start, 0), blockA+info[i].lhs_start*actual_kc, blockB, info[i].lhs_length, actual_kc, nc, alpha);
      }

      // Then keep going as usual with the remaining B'
      for(Index j=nc; j<cols; j+=nc)
      {
        const Index actual_nc = (std::min)(j+nc,cols)-j;

        // pack B_k,j to B'
        pack_rhs(blockB, rhs.getSubMapper(k,j), actual_kc, actual_nc);

        // C_j += A' * B'
        gebp(res.getSubMapper(0, j), blockA, blockB, rows, actual_kc, actual_nc, alpha);
      }

      // Release all the sub blocks A'_i of A' for the current thread,
      // i.e., we simply decrement the number of users by 1
      for(Index i=0; i<threads; ++i)
        #pragma omp atomic
        info[i].users -= 1;
    }
  }
  else
#endif // EIGEN_HAS_OPENMP
  {
    EIGEN_UNUSED_VARIABLE(info);

    // this is the sequential version!
    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*nc;

    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, blocking.blockB());

    const bool pack_rhs_once = mc!=rows && kc==depth && nc==cols;

    // For each horizontal panel of the rhs, and corresponding panel of the lhs...
    for(Index i2=0; i2<rows; i2+=mc)
    {
      const Index actual_mc = (std::min)(i2+mc,rows)-i2;

      for(Index k2=0; k2<depth; k2+=kc)
      {
        const Index actual_kc = (std::min)(k2+kc,depth)-k2;

        // OK, here we have selected one horizontal panel of rhs and one vertical panel of lhs.
        // => Pack lhs's panel into a sequential chunk of memory (L2/L3 caching)
        // Note that this panel will be read as many times as the number of blocks in the rhs's
        // horizontal panel which is, in practice, a very low number.
        pack_lhs(blockA, lhs.getSubMapper(i2,k2), actual_kc, actual_mc);

        // For each kc x nc block of the rhs's horizontal panel...
        for(Index j2=0; j2<cols; j2+=nc)
        {
          const Index actual_nc = (std::min)(j2+nc,cols)-j2;

          // We pack the rhs's block into a sequential chunk of memory (L2 caching)
          // Note that this block will be read a very high number of times, which is equal to the number of
          // micro horizontal panel of the large rhs's panel (e.g., rows/12 times).
          if((!pack_rhs_once) || i2==0)
            pack_rhs(blockB, rhs.getSubMapper(k2,j2), actual_kc, actual_nc);

          // Everything is packed, we can now call the panel * block kernel:
          gebp(res.getSubMapper(i2, j2), blockA, blockB, actual_mc, actual_kc, actual_nc, alpha);
        }
      }
    }
  }
}